

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cc
# Opt level: O2

string * __thiscall
flow::disassemble_abi_cxx11_
          (string *__return_storage_ptr__,flow *this,Instruction pc,size_t ip,size_t sp,
          ConstantPool *cp)

{
  undefined1 uVar1;
  size_type sVar2;
  string *psVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long *plVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  string_view format_str_05;
  string_view format_str_06;
  string_view format_str_07;
  string_view format_str_08;
  string_view format_str_09;
  unsigned_short *in_stack_fffffffffffffda8;
  int *in_stack_fffffffffffffdb0;
  Operand A;
  Operand B;
  Operand C;
  string word;
  undefined1 local_219;
  string local_218;
  long *local_1f8;
  long *local_1f0;
  string *local_1e8;
  flow *local_1e0;
  size_t sp_local;
  size_t ip_local;
  int local_1c4;
  char *mnemo;
  stringstream line;
  ostream local_1a8 [376];
  
  A = (Operand)((ulong)this >> 0x10);
  B = (Operand)((ulong)this >> 0x20);
  C = (Operand)((ulong)this >> 0x30);
  uVar13 = (uint)this & 0xff;
  mnemo = *(char **)(instructionInfos + (ulong)(uVar13 << 5) + 8);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sp;
  local_1e8 = __return_storage_ptr__;
  local_1e0 = this;
  sp_local = ip;
  ip_local = pc;
  std::__cxx11::stringstream::stringstream((stringstream *)&line);
  format_str.size_ = (size_t)&mnemo;
  format_str.data_ = (char *)0x6;
  fmt::v5::format<char_const*>(&word,(v5 *)"{:<10}",format_str,(char **)args);
  std::operator<<(local_1a8,(string *)&word);
  sVar2 = word._M_string_length;
  uVar15 = word._M_string_length;
  if (sp == 0) {
    iVar4 = *(int *)(instructionInfos + (ulong)(uVar13 << 5) + 0x10);
    if (iVar4 == 1) {
      format_str_02.size_ = (size_t)&A;
      format_str_02.data_ = (char *)0x2;
      fmt::v5::format<unsigned_short>
                (&local_218,(v5 *)0x165bdf,format_str_02,(unsigned_short *)args);
      std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator<<(local_1a8,(string *)&word);
    }
    else if (iVar4 == 2) {
      format_str_01.size_ = (size_t)&A;
      format_str_01.data_ = (char *)0x6;
      fmt::v5::format<unsigned_short,unsigned_short>
                (&local_218,(v5 *)0x165bdb,format_str_01,&B,(unsigned_short *)cp);
      std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator<<(local_1a8,(string *)&word);
    }
    else {
      if (iVar4 != 3) goto LAB_00157f31;
      format_str_00.size_ = (size_t)&A;
      format_str_00.data_ = (char *)0xa;
      fmt::v5::format<unsigned_short,unsigned_short,unsigned_short>
                (&local_218,(v5 *)"{}, {}, {}",format_str_00,&B,&C,in_stack_fffffffffffffda8);
      std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator<<(local_1a8,(string *)&word);
    }
    goto LAB_00157f2c;
  }
  switch(uVar13) {
  case 0xb:
    std::operator<<(local_1a8,"[");
    lVar14 = sVar2 + 1;
    lVar9 = *(long *)(sp + 0x78);
    lVar5 = (ulong)A * 0x18;
    local_1f8 = (long *)(lVar9 + lVar5);
    lVar8 = *(long *)(lVar9 + 8 + lVar5);
    lVar9 = *(long *)(lVar9 + lVar5);
    for (lVar5 = 0; lVar8 - lVar9 >> 3 != lVar5; lVar5 = lVar5 + 1) {
      if (lVar5 != 0) {
        std::operator<<(local_1a8,", ");
        lVar14 = lVar14 + 2;
      }
      std::__cxx11::to_string(&local_218,*(long *)(*local_1f8 + lVar5 * 8));
      std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator<<(local_1a8,(string *)&word);
      lVar14 = lVar14 + word._M_string_length;
    }
    std::operator<<(local_1a8,"]");
    goto LAB_00157d97;
  case 0xc:
    std::operator<<(local_1a8,'[');
    lVar14 = word._M_string_length + 1;
    lVar9 = *(long *)(sp + 0x90);
    lVar6 = (ulong)A * 0x18;
    lVar8 = *(long *)(lVar9 + 8 + lVar6);
    lVar5 = *(long *)(lVar9 + lVar6);
    lVar12 = 0;
    for (lVar10 = 0; lVar8 - lVar5 >> 5 != lVar10; lVar10 = lVar10 + 1) {
      if (lVar10 != 0) {
        std::operator<<(local_1a8,", ");
        lVar14 = lVar14 + 2;
      }
      poVar7 = std::operator<<(local_1a8,'\"');
      poVar7 = std::operator<<(poVar7,(string *)(*(long *)(lVar9 + lVar6) + lVar12));
      std::operator<<(poVar7,'\"');
      lVar14 = lVar14 + *(long *)(*(long *)(lVar9 + lVar6) + 8 + lVar12) + 2;
      lVar12 = lVar12 + 0x20;
    }
    std::operator<<(local_1a8,']');
    goto LAB_00157d97;
  case 0xd:
    std::operator<<(local_1a8,"[");
    lVar14 = sVar2 + 1;
    lVar9 = *(long *)(sp + 0xa8);
    lVar8 = (ulong)A * 0x18;
    local_1f0 = (long *)(lVar9 + lVar8);
    local_1f8 = (long *)((*(long *)(lVar9 + 8 + lVar8) - *(long *)(lVar9 + lVar8)) / 0x44);
    lVar9 = 0;
    for (plVar11 = (long *)0x0; local_1f8 != plVar11; plVar11 = (long *)((long)plVar11 + 1)) {
      if (plVar11 != (long *)0x0) {
        std::operator<<(local_1a8,", ");
        lVar14 = lVar14 + 2;
      }
      util::IPAddress::str_abi_cxx11_(&local_218,(IPAddress *)(*local_1f0 + lVar9));
      std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator<<(local_1a8,(string *)&word);
      lVar14 = lVar14 + word._M_string_length;
      lVar9 = lVar9 + 0x44;
    }
    std::operator<<(local_1a8,"]");
    goto LAB_00157d97;
  case 0xe:
    std::operator<<(local_1a8,"[");
    lVar14 = sVar2 + 1;
    lVar9 = *(long *)(sp + 0xc0);
    lVar8 = (ulong)A * 0x18;
    local_1f0 = (long *)(lVar9 + lVar8);
    local_1f8 = (long *)((*(long *)(lVar9 + 8 + lVar8) - *(long *)(lVar9 + lVar8)) / 0x50);
    lVar9 = 0;
    for (plVar11 = (long *)0x0; local_1f8 != plVar11; plVar11 = (long *)((long)plVar11 + 1)) {
      if (plVar11 != (long *)0x0) {
        std::operator<<(local_1a8,", ");
        lVar14 = lVar14 + 2;
      }
      util::Cidr::str_abi_cxx11_(&local_218,(Cidr *)(*local_1f0 + lVar9));
      std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator<<(local_1a8,(string *)&word);
      lVar14 = lVar14 + word._M_string_length;
      lVar9 = lVar9 + 0x50;
    }
    std::operator<<(local_1a8,"]");
LAB_00157d97:
    uVar15 = lVar14 + 1;
    goto LAB_00157f31;
  case 0xf:
    format_str_05.size_ = (size_t)&A;
    format_str_05.data_ = (char *)0x9;
    fmt::v5::format<unsigned_short>(&local_218,(v5 *)0x165bcd,format_str_05,(unsigned_short *)args);
    std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::operator<<(local_1a8,(string *)&word);
    break;
  case 0x10:
    format_str_04.size_ = (size_t)&A;
    format_str_04.data_ = (char *)0xa;
    fmt::v5::format<unsigned_short>
              (&local_218,(v5 *)"@STACK[{}]",format_str_04,(unsigned_short *)args);
    std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::operator<<(local_1a8,(string *)&word);
    break;
  case 0x11:
switchD_00157819_caseD_11:
    iVar4 = *(int *)(instructionInfos + (ulong)(uVar13 << 5) + 0x10);
    if (iVar4 == 1) {
      format_str_08.size_ = (size_t)&A;
      format_str_08.data_ = (char *)0x2;
      fmt::v5::format<unsigned_short>
                (&local_218,(v5 *)0x165bdf,format_str_08,(unsigned_short *)args);
      std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator<<(local_1a8,(string *)&word);
    }
    else if (iVar4 == 2) {
      format_str_07.size_ = (size_t)&A;
      format_str_07.data_ = (char *)0x6;
      fmt::v5::format<unsigned_short,unsigned_short>
                (&local_218,(v5 *)0x165bdb,format_str_07,&B,(unsigned_short *)cp);
      std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator<<(local_1a8,(string *)&word);
    }
    else {
      if (iVar4 != 3) goto LAB_00157f31;
      format_str_03.size_ = (size_t)&A;
      format_str_03.data_ = (char *)0xa;
      fmt::v5::format<unsigned_short,unsigned_short,unsigned_short>
                (&local_218,(v5 *)"{}, {}, {}",format_str_03,&B,&C,in_stack_fffffffffffffda8);
      std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator<<(local_1a8,(string *)&word);
    }
    break;
  case 0x12:
    std::__cxx11::to_string(&local_218,*(long *)(*(long *)sp + (ulong)A * 8));
    std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::operator<<(local_1a8,(string *)&word);
    break;
  default:
    if (uVar13 == 0x2b) {
      format_str_06.size_ = (ulong)A * 0x20 + *(long *)(sp + 0x18);
      format_str_06.data_ = (char *)0x4;
      fmt::v5::format<std::__cxx11::string>(&local_218,(v5 *)0x1603cf,format_str_06,args);
      std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator<<(local_1a8,(string *)&word);
    }
    else if (uVar13 == 0x3d) {
      util::IPAddress::str_abi_cxx11_
                (&local_218,(IPAddress *)((ulong)A * 0x44 + *(long *)(sp + 0x30)));
      std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator<<(local_1a8,(string *)&word);
    }
    else if (uVar13 == 0x41) {
      util::Cidr::str_abi_cxx11_(&local_218,(Cidr *)((ulong)A * 0x50 + *(long *)(sp + 0x48)));
      std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator<<(local_1a8,(string *)&word);
    }
    else if (uVar13 == 0x49) {
      std::__cxx11::string::_M_assign((string *)&word);
      std::operator<<(local_1a8,(string *)&word);
    }
    else {
      if (uVar13 != 0x4a) goto switchD_00157819_caseD_11;
      std::__cxx11::string::_M_assign((string *)&word);
      std::operator<<(local_1a8,(string *)&word);
    }
  }
LAB_00157f2c:
  uVar15 = sVar2 + word._M_string_length;
LAB_00157f31:
  for (; uVar15 < 0x23; uVar15 = uVar15 + 1) {
    std::operator<<(local_1a8,' ');
  }
  iVar4 = getStackChange((Instruction)local_1e0);
  uVar1 = 0x2d;
  if (iVar4 == 0) {
    uVar1 = 0x20;
  }
  local_219 = 0x2b;
  if (iVar4 < 1) {
    local_219 = uVar1;
  }
  local_1c4 = -iVar4;
  if (0 < iVar4) {
    local_1c4 = iVar4;
  }
  format_str_09.size_ = (size_t)&ip_local;
  format_str_09.data_ = (char *)0x1a;
  fmt::v5::format<unsigned_long,unsigned_long,char,int>
            (&local_218,(v5 *)"; ip={:>3} sp={:>2} ({}{})",format_str_09,&sp_local,
             (unsigned_long *)&local_219,(char *)&local_1c4,in_stack_fffffffffffffdb0);
  std::__cxx11::string::operator=((string *)&word,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::operator<<(local_1a8,(string *)&word);
  psVar3 = local_1e8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&word);
  std::__cxx11::stringstream::~stringstream((stringstream *)&line);
  return psVar3;
}

Assistant:

std::string disassemble(Instruction pc, size_t ip, size_t sp, const ConstantPool* cp) {
  const Opcode opc = opcode(pc);
  const Operand A = operandA(pc);
  const Operand B = operandB(pc);
  const Operand C = operandC(pc);
  const char* mnemo = mnemonic(opc);
  std::stringstream line;
  size_t n = 0;

  std::string word = fmt::format("{:<10}", mnemo);
  line << word;
  n += word.size();

  // operands
  if (cp != nullptr) {
    switch (opc) {
      case Opcode::ITLOAD: {
        line << "[";
        n++;
        const std::vector<FlowNumber>& v = cp->getIntArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          word = std::to_string(v[i]);
          line << word;
          n += word.size();
        }
        line << "]";
        n++;
        break;
      }
      case Opcode::STLOAD: {
        line << '[';
        n++;
        const std::vector<std::string>& v = cp->getStringArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          line << '"' << v[i] << '"';
          n += v[i].size() + 2;
        }
        line << ']';
        n += 1;
        break;
      }
      case Opcode::PTLOAD: {
        line << "[";
        n++;
        const std::vector<util::IPAddress>& v = cp->getIPAddressArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          word = v[i].str();
          line << word;
          n += word.size();
        }
        line << "]";
        n++;
        break;
      }
      case Opcode::CTLOAD: {
        line << "[";
        n++;
        const std::vector<util::Cidr>& v = cp->getCidrArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          word = v[i].str();
          line << word;
          n += word.size();
        }
        line << "]";
        n++;
        break;
      }
      case Opcode::LOAD:
        word = fmt::format("STACK[{}]", A);
        line << word;
        n += word.size();
        break;
      case Opcode::STORE:
        word = fmt::format("@STACK[{}]", A);
        line << word;
        n += word.size();
        break;
      case Opcode::NLOAD:
        word = std::to_string(cp->getInteger(A));
        line << word;
        n += word.size();
        break;
      case Opcode::SLOAD:
        word = fmt::format("\"{}\"", cp->getString(A));
        line << word;
        n += word.size();
        break;
      case Opcode::PLOAD:
        word = cp->getIPAddress(A).str();
        line << word;
        n += word.size();
        break;
      case Opcode::CLOAD:
        word = cp->getCidr(A).str();
        line << word;
        n += word.size();
        break;
      case Opcode::CALL:
        word = cp->getNativeFunctionSignatures()[A];
        line << word;
        n += word.size();
        break;
      case Opcode::HANDLER:
        word = cp->getNativeHandlerSignatures()[A];
        line << word;
        n += word.size();
        break;
      default:
        switch (operandSignature(opc)) {
          case OperandSig::III:
            word = fmt::format("{}, {}, {}", A, B, C);
            line << word;
            n += word.size();
            break;
          case OperandSig::II:
            word = fmt::format("{}, {}", A, B);
            line << word;
            n += word.size();
            break;
          case OperandSig::I:
            word = fmt::format("{}", A);
            line << word;
            n += word.size();
            break;
          case OperandSig::V:
            break;
        }
        break;
    }
  } else {
    switch (operandSignature(opc)) {
      case OperandSig::III:
        word = fmt::format("{}, {}, {}", A, B, C);
        line << word;
        n += word.size();
        break;
      case OperandSig::II:
        word = fmt::format("{}, {}", A, B);
        line << word;
        n += word.size();
        break;
      case OperandSig::I:
        word = fmt::format("{}", A);
        line << word;
        n += word.size();
        break;
      case OperandSig::V:
        break;
    }
  }

  while (n < 35) {
    line << ' ';
    n++;
  }

  int stackChange = getStackChange(pc);

  word = fmt::format("; ip={:>3} sp={:>2} ({}{})",
                     ip, sp,
                     stackChange > 0 ? '+' :
                         stackChange < 0 ? '-' : ' ',
                     std::abs(stackChange));
  line << word;

  return line.str();
}